

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Totp.cpp
# Opt level: O0

ssize_t __thiscall Vault::Totp::read(Totp *this,int __fd,void *__buf,size_t __nbytes)

{
  Client *client;
  undefined4 in_register_00000034;
  Totp *this_00;
  string local_80;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  Url local_40;
  void *local_20;
  Path *path_local;
  Totp *this_local;
  
  this_00 = (Totp *)CONCAT44(in_register_00000034,__fd);
  client = *(Client **)this_00;
  local_20 = __buf;
  path_local = (Path *)this_00;
  this_local = this;
  Vault::operator+(&local_80,"keys/",
                   (Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)__buf);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_60,&local_80);
  getUrl(&local_40,this_00,&local_60);
  HttpConsumer::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,client,&local_40);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Totp::read(const Path &path) {
  return Vault::HttpConsumer::get(client_, getUrl(Vault::Path{"keys/" + path}));
}